

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O3

void __thiscall
HACD::MyWuQuantizer::normalizeInput(MyWuQuantizer *this,HaU32 vcount,HaF32 *vertices)

{
  Vec3 *pVVar1;
  float fVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  Vec3 *pVVar6;
  bool bVar7;
  float fVar8;
  uint uVar9;
  uint uVar10;
  HaU32 capacity;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  HaF32 HVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  
  (this->mNormalizedInput).mSize = 0;
  (this->mQuantizedOutput).mSize = 0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)vertices;
  auVar23 = ZEXT1664(auVar15);
  HVar17 = vertices[2];
  auVar20 = auVar15;
  fVar14 = (float)HVar17;
  if (1 < vcount) {
    auVar20 = vmovshdup_avx(auVar15);
    auVar24 = ZEXT1664(auVar20);
    uVar12 = 3;
    auVar28 = ZEXT1664(auVar15);
    auVar27 = ZEXT1664(auVar20);
    do {
      uVar13 = uVar12 & 0xffffffff;
      fVar2 = (float)vertices[uVar13];
      if (auVar23._0_4_ <= fVar2) {
        if (auVar28._0_4_ < fVar2) {
          auVar28 = ZEXT1664(ZEXT416((uint)fVar2));
        }
      }
      else {
        auVar23 = ZEXT1664(ZEXT416((uint)fVar2));
      }
      fVar2 = (float)vertices[uVar13 + 1];
      if (auVar24._0_4_ <= fVar2) {
        if (auVar27._0_4_ < fVar2) {
          auVar27 = ZEXT1664(ZEXT416((uint)fVar2));
        }
      }
      else {
        auVar24 = ZEXT1664(ZEXT416((uint)fVar2));
      }
      fVar2 = (float)vertices[uVar13 + 2];
      fVar8 = fVar2;
      if (((float)HVar17 <= fVar2) && (fVar8 = (float)HVar17, fVar14 < fVar2)) {
        fVar14 = fVar2;
      }
      HVar17 = (HaF32)fVar8;
      uVar12 = uVar12 + 3;
    } while ((ulong)vcount * 3 != uVar12);
    auVar15 = vinsertps_avx(auVar23._0_16_,auVar24._0_16_,0x10);
    auVar20 = vinsertps_avx(auVar28._0_16_,auVar27._0_16_,0x10);
  }
  auVar16 = vsubps_avx(auVar20,auVar15);
  auVar25._0_4_ = (auVar20._0_4_ + auVar15._0_4_) * 0.5;
  auVar25._4_4_ = (auVar20._4_4_ + auVar15._4_4_) * 0.5;
  auVar25._8_4_ = (auVar20._8_4_ + auVar15._8_4_) * 0.5;
  auVar25._12_4_ = (auVar20._12_4_ + auVar15._12_4_) * 0.5;
  uVar4 = vmovlps_avx(auVar25);
  (this->mCenter).x = (HaF32)(int)uVar4;
  (this->mCenter).y = (HaF32)(int)((ulong)uVar4 >> 0x20);
  uVar12 = vcmpps_avx512vl(auVar16,ZEXT816(0) << 0x40,0);
  auVar20._8_4_ = 0x3f8020c5;
  auVar20._0_8_ = 0x3f8020c53f8020c5;
  auVar20._12_4_ = 0x3f8020c5;
  auVar15 = vmulps_avx512vl(auVar16,auVar20);
  auVar18._8_4_ = 0x3f800000;
  auVar18._0_8_ = 0x3f8000003f800000;
  auVar18._12_4_ = 0x3f800000;
  (this->mCenter).z = (HaF32)((fVar14 + (float)HVar17) * 0.5);
  auVar26._0_12_ = ZEXT812(0);
  auVar26._12_4_ = 0;
  bVar7 = (bool)((byte)uVar12 & 1);
  auVar16._0_4_ = (uint)bVar7 * 0x3f800000 | (uint)!bVar7 * (int)(auVar15._0_4_ * 0.5);
  bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
  auVar16._4_4_ = (uint)bVar7 * 0x3f800000 | (uint)!bVar7 * (int)(auVar15._4_4_ * 0.5);
  bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
  auVar16._8_4_ = (uint)bVar7 * 0x3f800000 | (uint)!bVar7 * (int)(auVar15._8_4_ * 0.5);
  bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
  auVar16._12_4_ = (uint)bVar7 * 0x3f800000 | (uint)!bVar7 * (int)(auVar15._12_4_ * 0.5);
  uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar14 - (float)HVar17)),auVar26,0);
  bVar7 = (bool)((byte)uVar4 & 1);
  uVar4 = vmovlps_avx(auVar16);
  (this->mScale).x = (HaF32)(int)uVar4;
  (this->mScale).y = (HaF32)(int)((ulong)uVar4 >> 0x20);
  fVar14 = (float)((uint)bVar7 * 0x3f800000 +
                  (uint)!bVar7 * (int)((fVar14 - (float)HVar17) * 1.001 * 0.5));
  (this->mScale).z = (HaF32)fVar14;
  if (vcount != 0) {
    auVar15 = vdivps_avx(auVar18,auVar16);
    auVar23 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    uVar12 = 0;
    uVar10 = 0;
    do {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(vertices + (uVar12 & 0xffffffff));
      uVar3 = (this->mCenter).x;
      uVar5 = (this->mCenter).y;
      auVar21._4_4_ = uVar5;
      auVar21._0_4_ = uVar3;
      auVar21._8_8_ = 0;
      auVar20 = vsubps_avx(auVar19,auVar21);
      auVar22._0_4_ = auVar15._0_4_ * auVar20._0_4_;
      auVar22._4_4_ = auVar15._4_4_ * auVar20._4_4_;
      auVar22._8_4_ = auVar15._8_4_ * auVar20._8_4_;
      auVar22._12_4_ = auVar15._12_4_ * auVar20._12_4_;
      auVar16 = auVar23._0_16_;
      auVar20 = vandps_avx(auVar22,auVar16);
      if (1.0 < auVar20._0_4_) {
        __assert_fail("v.x >= -1 && v.x <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                      ,0x3ef,"void HACD::MyWuQuantizer::normalizeInput(HaU32, const HaF32 *)");
      }
      auVar20 = vmovshdup_avx(auVar22);
      auVar20 = vandps_avx(auVar20,auVar16);
      if (1.0 < auVar20._0_4_) {
        __assert_fail("v.y >= -1 && v.y <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                      ,0x3f0,"void HACD::MyWuQuantizer::normalizeInput(HaU32, const HaF32 *)");
      }
      fVar2 = (1.0 / fVar14) *
              ((float)vertices[(uVar12 & 0xffffffff) + 2] - (float)(this->mCenter).z);
      auVar20 = vandps_avx(ZEXT416((uint)fVar2),auVar16);
      if (1.0 < auVar20._0_4_) {
        __assert_fail("v.z >= -1 && v.z <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                      ,0x3f1,"void HACD::MyWuQuantizer::normalizeInput(HaU32, const HaF32 *)");
      }
      uVar11 = (this->mNormalizedInput).mCapacity & 0x7fffffff;
      uVar9 = uVar10;
      if (uVar11 <= uVar10) {
        uVar10 = uVar11 * 2;
        if (uVar11 == 0) {
          uVar10 = 1;
        }
        if (uVar10 <= uVar11) {
          __assert_fail("this->capacity() < capacity",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                        ,0x208,"void hacd::vector<HACD::Vec3>::grow(HaU32) [T = HACD::Vec3]");
        }
        hacd::vector<HACD::Vec3>::recreate(&this->mNormalizedInput,uVar10);
        auVar23 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        uVar9 = (this->mNormalizedInput).mSize;
      }
      pVVar6 = (this->mNormalizedInput).mData;
      uVar10 = uVar9 + 1;
      uVar12 = uVar12 + 3;
      pVVar1 = pVVar6 + uVar9;
      uVar4 = vmovlps_avx(auVar22);
      pVVar1->x = (HaF32)(int)uVar4;
      pVVar1->y = (HaF32)(int)((ulong)uVar4 >> 0x20);
      pVVar6[uVar9].z = (HaF32)fVar2;
      (this->mNormalizedInput).mSize = uVar10;
    } while ((ulong)vcount * 3 != uVar12);
  }
  return;
}

Assistant:

void normalizeInput(HaU32 vcount,const HaF32 *vertices)
	{
		mNormalizedInput.clear();
		mQuantizedOutput.clear();
		Vec3 bmin(vertices);
		Vec3 bmax(vertices);
		for (HaU32 i=1; i<vcount; i++)
		{
			Vec3 v(&vertices[i*3]);

			if ( v.x < bmin.x ) 
			{
				bmin.x = v.x;
			}
			else if ( v.x > bmax.x )
			{
				bmax.x = v.x;
			}

			if ( v.y < bmin.y ) 
			{
				bmin.y = v.y;
			}
			else if ( v.y > bmax.y )
			{
				bmax.y = v.y;
			}

			if ( v.z < bmin.z ) 
			{
				bmin.z = v.z;
			}
			else if ( v.z > bmax.z )
			{
				bmax.z = v.z;
			}
		}

		mCenter.x = (bmin.x+bmax.x)*0.5f;
		mCenter.y = (bmin.y+bmax.y)*0.5f;
		mCenter.z = (bmin.z+bmax.z)*0.5f;

		HaF32 dx = bmax.x-bmin.x;
		HaF32 dy = bmax.y-bmin.y;
		HaF32 dz = bmax.z-bmin.z;

		if ( dx == 0 )
		{
			mScale.x = 1;
		}
		else
		{
			dx = dx*1.001f;
			mScale.x = dx*0.5f;
		}
		if ( dy == 0 )
		{
			mScale.y = 1;
		}
		else
		{
			dy = dy*1.001f;
			mScale.y = dy*0.5f;
		}
		if ( dz == 0 )
		{
			mScale.z = 1;
		}
		else
		{
			dz = dz*1.001f;
			mScale.z = dz*0.5f;
		}

		Vec3 recip;
		recip.x = 1.0f / mScale.x;
		recip.y = 1.0f / mScale.y;
		recip.z = 1.0f / mScale.z;

		for (HaU32 i=0; i<vcount; i++)
		{
			Vec3 v(&vertices[i*3]);

			v.x = (v.x-mCenter.x)*recip.x;
			v.y = (v.y-mCenter.y)*recip.y;
			v.z = (v.z-mCenter.z)*recip.z;

			HACD_ASSERT( v.x >= -1 && v.x <= 1 );
			HACD_ASSERT( v.y >= -1 && v.y <= 1 );
			HACD_ASSERT( v.z >= -1 && v.z <= 1 );
			mNormalizedInput.push_back(v);
		}
	}